

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOptions.h
# Opt level: O0

void __thiscall
EncryptionOptions::EncryptionOptions
          (EncryptionOptions *this,string *inUserPassword,longlong inUserProtectionOptionsFlag,
          string *inOwnerPassword)

{
  string *inOwnerPassword_local;
  longlong inUserProtectionOptionsFlag_local;
  string *inUserPassword_local;
  EncryptionOptions *this_local;
  
  std::__cxx11::string::string((string *)&this->UserPassword);
  std::__cxx11::string::string((string *)&this->OwnerPassword);
  this->ShouldEncrypt = true;
  std::__cxx11::string::operator=((string *)&this->UserPassword,(string *)inUserPassword);
  this->UserProtectionOptionsFlag = inUserProtectionOptionsFlag;
  std::__cxx11::string::operator=((string *)&this->OwnerPassword,(string *)inOwnerPassword);
  return;
}

Assistant:

EncryptionOptions(const std::string& inUserPassword,
					long long inUserProtectionOptionsFlag,
					const std::string& inOwnerPassword) {
		ShouldEncrypt = true;
		UserPassword = inUserPassword;
		UserProtectionOptionsFlag = inUserProtectionOptionsFlag;
		OwnerPassword = inOwnerPassword;
	}